

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O2

word_type bv::internal::packed_view<std::vector>::compute_field_mask(size_t width)

{
  word_type wVar1;
  size_t i;
  ulong uVar2;
  
  wVar1 = 0;
  for (uVar2 = 0; uVar2 < 0x40 / width; uVar2 = uVar2 + 1) {
    wVar1 = wVar1 << (width & 0x3f) | 1;
  }
  return wVar1;
}

Assistant:

typename packed_view<C>::word_type
        packed_view<C>::compute_field_mask(size_t width)
        {
            size_t fields_per_word = W / width;
            word_type mask = 0;
            
            for(size_t i = 0; i < fields_per_word; ++i)
            {
                mask = mask << width;
                mask = mask | 1;
            }
            
            return mask;
        }